

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O1

uint64_t compute_cdef_dist(void *dst,int dstride,uint16_t *src,cdef_list *dlist,int cdef_count,
                          BLOCK_SIZE bsize,int coeff_shift,int row,int col)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint8_t *puVar9;
  undefined7 in_register_00000089;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  
  uVar10 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  uVar12 = 0;
  uVar8 = (uint)block_size_wide[uVar10];
  if (cdef_count < 1) {
    uVar10 = 0;
  }
  else {
    bVar1 = block_size_high[uVar10];
    uVar2 = ""[uVar10];
    uVar3 = ""[uVar10];
    iVar4 = (uint)((0x4001cUL >> ((ulong)bsize & 0x3f) & 1) == 0) * 2 + 1;
    uVar10 = 0;
    iVar7 = 0;
    do {
      iVar11 = (int)uVar12;
      puVar9 = (uint8_t *)
               ((long)dst +
               (long)(int)(((uint)dlist[uVar12].bx << (uVar2 + 2 & 0x1f)) +
                          ((uint)dlist[uVar12].by << (uVar3 + 2 & 0x1f)) * dstride) +
               (long)(row * dstride + col));
      if (((iVar4 + iVar7 < cdef_count) && (dlist[uVar12].by == dlist[(uint)(iVar11 + iVar4)].by))
         && ((uint)dlist[uVar12].bx + iVar4 == (uint)dlist[(uint)(iVar11 + iVar4)].bx)) {
        uVar5 = (*aom_mse_16xh_16bit)
                          (puVar9,dstride,src + (iVar11 << (uVar3 + 2 + uVar2 + 2 & 0x1f)),uVar8,
                           (uint)bVar1);
        iVar6 = (int)(0x10 / (ulong)uVar8);
      }
      else {
        uVar5 = (*aom_mse_wxh_16bit)
                          (puVar9,dstride,src + (iVar11 << (uVar3 + 2 + uVar2 + 2 & 0x1f)),uVar8,
                           uVar8,(uint)bVar1);
        iVar6 = 1;
      }
      uVar10 = uVar10 + uVar5;
      iVar7 = iVar7 + iVar6;
      uVar12 = (ulong)(uint)(iVar11 + iVar6);
    } while (iVar11 + iVar6 < cdef_count);
  }
  return uVar10 >> ((char)coeff_shift * '\x02' & 0x3fU);
}

Assistant:

static uint64_t compute_cdef_dist(void *dst, int dstride, uint16_t *src,
                                  cdef_list *dlist, int cdef_count,
                                  BLOCK_SIZE bsize, int coeff_shift, int row,
                                  int col) {
  assert(bsize == BLOCK_4X4 || bsize == BLOCK_4X8 || bsize == BLOCK_8X4 ||
         bsize == BLOCK_8X8);
  uint64_t sum = 0;
  int bi, bx, by;
  int iter = 0;
  int inc = 1;
  uint8_t *dst8 = (uint8_t *)dst;
  uint8_t *dst_buff = &dst8[row * dstride + col];
  int src_stride, width, height, width_log2, height_log2;
  init_src_params(&src_stride, &width, &height, &width_log2, &height_log2,
                  bsize);

  const int num_blks = 16 / width;
  for (bi = 0; bi < cdef_count; bi += inc) {
    by = dlist[bi].by;
    bx = dlist[bi].bx;
    uint16_t *src_tmp = &src[bi << (height_log2 + width_log2)];
    uint8_t *dst_tmp =
        &dst_buff[(by << height_log2) * dstride + (bx << width_log2)];

    if (is_dual_or_quad_applicable(dlist, width, cdef_count, bi, iter)) {
      sum += aom_mse_16xh_16bit(dst_tmp, dstride, src_tmp, width, height);
      iter += num_blks;
      inc = num_blks;
    } else {
      sum += aom_mse_wxh_16bit(dst_tmp, dstride, src_tmp, src_stride, width,
                               height);
      iter += 1;
      inc = 1;
    }
  }

  return sum >> 2 * coeff_shift;
}